

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLBINDBUFFERBASEPROC epoxy_glBindBufferBase_resolver(void)

{
  PFNGLBINDBUFFERBASEPROC p_Var1;
  
  p_Var1 = (PFNGLBINDBUFFERBASEPROC)
           gl_provider_resolver
                     ("glBindBufferBase",epoxy_glBindBufferBase_resolver::providers,
                      epoxy_glBindBufferBase_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLBINDBUFFERBASEPROC
epoxy_glBindBufferBase_resolver(void)
{
    static const enum gl_provider providers[] = {
        Desktop_OpenGL_3_0,
        Desktop_OpenGL_3_1,
        GL_extension_GL_ARB_uniform_buffer_object,
        OpenGL_ES_3_0,
        GL_extension_GL_EXT_transform_feedback,
        GL_extension_GL_NV_transform_feedback,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        920 /* "glBindBufferBase" */,
        920 /* "glBindBufferBase" */,
        920 /* "glBindBufferBase" */,
        920 /* "glBindBufferBase" */,
        937 /* "glBindBufferBaseEXT" */,
        957 /* "glBindBufferBaseNV" */,
    };
    return gl_provider_resolver(entrypoint_strings + 920 /* "glBindBufferBase" */,
                                providers, entrypoints);
}